

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

void * bc_realloc(void *ptr,size_t size)

{
  void *pvVar1;
  void *rv;
  size_t size_local;
  void *ptr_local;
  
  pvVar1 = realloc(ptr,size);
  if ((pvVar1 == (void *)0x0) && (size != 0)) {
    fprintf(_stderr,"fatal: Failed to reallocate memory!\n");
    free(ptr);
    abort();
  }
  return pvVar1;
}

Assistant:

void*
bc_realloc(void *ptr, size_t size)
{
    // simple things even simpler :P
    void *rv = realloc(ptr, size);
    if (rv == NULL && size != 0) {
        fprintf(stderr, "fatal: Failed to reallocate memory!\n");
        free(ptr);
        abort();
    }
    return rv;
}